

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

unsigned_long duckdb::ParquetDecodeUtils::VarintDecode<unsigned_long,true>(ByteBuffer *buf)

{
  byte bVar1;
  byte bVar2;
  runtime_error *this;
  byte bVar3;
  ulong uVar4;
  
  bVar3 = 0;
  uVar4 = 0;
  while( true ) {
    ByteBuffer::available(buf,1);
    bVar1 = *buf->ptr;
    buf->len = buf->len - 1;
    buf->ptr = buf->ptr + 1;
    bVar2 = bVar3 & 0x3f;
    if (((char)bVar1 < '\0') && (bVar3 = bVar3 + 7, 0x40 < bVar3)) break;
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << bVar2;
    if (-1 < (char)bVar1) {
      return uVar4;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Varint-decoding found too large number");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T VarintDecode(ByteBuffer &buf) {
		T result = 0;
		uint8_t shift = 0;
		while (true) {
			uint8_t byte;
			if (CHECKED) {
				byte = buf.read<uint8_t>();
			} else {
				byte = buf.unsafe_read<uint8_t>();
			}
			result |= T(byte & 127) << shift;
			if ((byte & 128) == 0) {
				break;
			}
			shift += 7;
			if (shift > sizeof(T) * 8) {
				throw std::runtime_error("Varint-decoding found too large number");
			}
		}
		return result;
	}